

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall yactfr::internal::JsonErtFragValReq::JsonErtFragValReq(JsonErtFragValReq *this)

{
  JsonAnyFullDtValReq *anyFullDtValReq;
  bool isRequired;
  bool isRequired_00;
  long lVar1;
  undefined8 in_stack_fffffffffffffd78;
  undefined1 allowNull;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  allocator local_270 [8];
  type in_stack_fffffffffffffd98;
  JsonObjValPropReq local_260;
  string local_248;
  string local_228;
  string local_208;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_1b0;
  PropReqsEntry local_178;
  PropReqsEntry local_140 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_d0;
  PropReqsEntry local_98;
  PropReqsEntry local_60;
  
  allowNull = (undefined1)((ulong)in_stack_fffffffffffffd78 >> 0x38);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_00360d38;
  std::__cxx11::string::string((string *)&local_208,"event-record-class",&local_271);
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (&local_178,(_anonymous_namespace_ *)0x0,isRequired);
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_140,(_anonymous_namespace_ *)0x0,isRequired_00);
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  JsonValReq::shared((optional<yactfr::internal::JsonValKind>)in_stack_fffffffffffffd98,
                     (bool)allowNull);
  JsonObjValPropReq::JsonObjValPropReq(&local_260,(Sp *)local_270,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>(&local_d0,&strs::dscId,&local_260);
  std::__cxx11::string::string((string *)&local_228,"specific-context-field-class",&local_272);
  anyFullDtValReq = &this->_anyFullDtValReq;
  anon_unknown_0::anyDtPropReqEntry(&local_98,&local_228,anyFullDtValReq,false);
  std::__cxx11::string::string((string *)&local_248,"payload-field-class",&local_273);
  anon_unknown_0::anyDtPropReqEntry(&local_60,&local_248,anyFullDtValReq,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_1e8,&local_1b0,&stack0xffffffffffffffd8,0,&local_274,&local_275,&local_276);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_208,(PropReqs *)&local_1e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e8);
  lVar1 = 0x150;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
             *)((long)&local_1b0.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x38);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_260._valReq.
              super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffd98);
  std::__cxx11::string::~string((string *)&local_208);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_00360d38;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(anyFullDtValReq);
  return;
}

Assistant:

explicit JsonErtFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::dscId, {JsonValReq::shared(JsonVal::Kind::UInt)}},
            anyDtPropReqEntry(strs::specCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::payloadFc, _anyFullDtValReq), //-V1050
        }}
    {
    }